

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O2

bool SignTransaction(CMutableTransaction *mtx,SigningProvider *keystore,
                    map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                    *coins,int nHashType,
                    map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                    *input_errors)

{
  _Base_ptr *txout;
  long lVar1;
  pointer pCVar2;
  long lVar3;
  string original;
  string original_00;
  string original_01;
  bool bVar4;
  ulong uVar5;
  const_iterator cVar6;
  mapped_type *pmVar7;
  bilingual_str *this;
  uint uVar8;
  string *this_00;
  ScriptError nIn;
  string *__return_storage_ptr__;
  uint uVar9;
  CTxIn *input;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffff968;
  map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
  *pmVar10;
  ScriptError local_654;
  allocator<char> local_64d;
  ScriptError serror;
  vector<CTxOut,_std::allocator<CTxOut>_> spent_outputs;
  string local_628;
  string local_608;
  string local_5e8;
  MutableTransactionSignatureCreator local_5c8;
  SignatureData sigdata;
  PrecomputedTransactionData txdata;
  CTransaction txConst;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = nHashType & 0xffffff7f;
  CTransaction::CTransaction(&txConst,mtx);
  uVar9 = 0;
  memset(&txdata,0,0x102);
  txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  txdata._281_8_ = 0;
  spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  while( true ) {
    pCVar2 = (mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = ((long)(mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pCVar2) / 0x68;
    if (uVar5 <= uVar9) break;
    cVar6 = std::
            _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
            ::find((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                    *)coins,&pCVar2[uVar9].prevout);
    if ((cVar6._M_node == (_Base_ptr)(coins + 8)) ||
       (cVar6._M_node[2]._M_parent == (_Base_ptr)0xffffffffffffffff)) {
      sigdata.complete = false;
      sigdata.witness = false;
      sigdata._2_6_ = 0;
      sigdata.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
      sigdata.scriptSig.super_CScriptBase._union._8_8_ = 0;
      PrecomputedTransactionData::Init<CTransaction>
                (&txdata,&txConst,(vector<CTxOut,_std::allocator<CTxOut>_> *)&sigdata,true);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)&sigdata);
      uVar5 = ((long)(mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x68;
      break;
    }
    std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long_const&,CScript_const&>
              ((vector<CTxOut,std::allocator<CTxOut>> *)&spent_outputs,
               (long *)&cVar6._M_node[2]._M_parent,(CScript *)&cVar6._M_node[2]._M_left);
    uVar9 = uVar9 + 1;
  }
  if (((long)spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_finish -
      (long)spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start) / 0x28 == uVar5) {
    PrecomputedTransactionData::Init<CTransaction>(&txdata,&txConst,&spent_outputs,true);
  }
  nIn = SCRIPT_ERR_OK;
  pmVar10 = input_errors;
  do {
    uVar5 = (ulong)nIn;
    pCVar2 = (mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar2) / 0x68) <= uVar5) {
      lVar3 = *(long *)(input_errors + 0x28);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&spent_outputs);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txdata.m_spent_outputs);
      CTransaction::~CTransaction(&txConst);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return lVar3 == 0;
      }
      __stack_chk_fail();
    }
    input = pCVar2 + uVar5;
    cVar6 = std::
            _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
            ::find((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                    *)coins,&input->prevout);
    if ((cVar6._M_node == (_Base_ptr)(coins + 8)) ||
       (cVar6._M_node[2]._M_parent == (_Base_ptr)0xffffffffffffffff)) {
      _((bilingual_str *)&sigdata,(ConstevalStringLiteral)0x23798e);
      local_5c8.super_BaseSignatureCreator._vptr_BaseSignatureCreator._0_4_ = nIn;
      pmVar7 = std::
               map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
               ::operator[](input_errors,(key_type_conflict *)&local_5c8);
      bilingual_str::operator=(pmVar7,(bilingual_str *)&sigdata);
      bilingual_str::~bilingual_str((bilingual_str *)&sigdata);
    }
    else {
      txout = &cVar6._M_node[2]._M_parent;
      DataFromTransaction(&sigdata,mtx,nIn,(CTxOut *)txout);
      if ((uVar8 != 3) ||
         (input_errors = pmVar10,
         uVar5 < (ulong)(((long)(mtx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(mtx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x28))) {
        MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
                  (&local_5c8,mtx,nIn,(CAmount *)txout,&txdata,nHashType);
        ProduceSignature(keystore,&local_5c8.super_BaseSignatureCreator,
                         (CScript *)&cVar6._M_node[2]._M_left,&sigdata);
        input_errors = pmVar10;
      }
      UpdateInput(input,&sigdata);
      if ((*txout == (_Base_ptr)0x775f05a074000) &&
         ((input->scriptWitness).stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (input->scriptWitness).stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        _((bilingual_str *)&local_5c8,(ConstevalStringLiteral)0x2379af);
        pmVar10 = input_errors;
        serror = nIn;
        pmVar7 = std::
                 map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                 ::operator[](input_errors,(key_type_conflict *)&serror);
        bilingual_str::operator=(pmVar7,(bilingual_str *)&local_5c8);
        bilingual_str::~bilingual_str((bilingual_str *)&local_5c8);
      }
      else {
        serror = SCRIPT_ERR_OK;
        pmVar10 = input_errors;
        if (sigdata.complete == false) {
          local_5c8.super_BaseSignatureCreator._vptr_BaseSignatureCreator =
               (_func_int **)&PTR_CheckECDSASignature_003bf720;
          local_5c8.m_txto = (CMutableTransaction *)&txConst;
          local_5c8.nIn = 1;
          local_5c8.checker.super_BaseSignatureChecker._vptr_BaseSignatureChecker =
               (_func_int **)&txdata;
          local_5c8.nHashType = nIn;
          local_5c8.amount = (CAmount)*txout;
          bVar4 = VerifyScript(&input->scriptSig,(CScript *)&cVar6._M_node[2]._M_left,
                               &input->scriptWitness,0x1fffdf,(BaseSignatureChecker *)&local_5c8,
                               &serror);
          if (!bVar4) {
            if (serror == SCRIPT_ERR_SIG_NULLFAIL) {
              this_00 = &local_608;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)this_00,
                         "CHECK(MULTI)SIG failing with non-zero signature (possibly need more signatures)"
                         ,&local_64d);
              original_00._M_string_length = (size_type)mtx;
              original_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff968;
              original_00.field_2._M_allocated_capacity._0_4_ = nHashType;
              original_00.field_2._M_allocated_capacity._4_4_ = uVar8;
              original_00.field_2._8_8_ = pmVar10;
              Untranslated((bilingual_str *)&local_5c8,original_00);
              local_654 = nIn;
              this = std::
                     map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                     ::operator[](input_errors,(key_type_conflict *)&local_654);
LAB_00185556:
              bilingual_str::operator=(this,(bilingual_str *)&local_5c8);
              bilingual_str::~bilingual_str((bilingual_str *)&local_5c8);
              __return_storage_ptr__ = this_00;
            }
            else {
              this_00 = &local_5e8;
              __return_storage_ptr__ = &local_628;
              if (serror == SCRIPT_ERR_INVALID_STACK_OPERATION) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)this_00,
                           "Unable to sign input, invalid stack size (possibly missing key)",
                           &local_64d);
                original._M_string_length = (size_type)mtx;
                original._M_dataplus._M_p = (pointer)in_stack_fffffffffffff968;
                original.field_2._M_allocated_capacity._0_4_ = nHashType;
                original.field_2._M_allocated_capacity._4_4_ = uVar8;
                original.field_2._8_8_ = pmVar10;
                Untranslated((bilingual_str *)&local_5c8,original);
                local_654 = nIn;
                this = std::
                       map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                       ::operator[](input_errors,(key_type_conflict *)&local_654);
                goto LAB_00185556;
              }
              ScriptErrorString_abi_cxx11_(__return_storage_ptr__,serror);
              original_01._M_string_length = (size_type)mtx;
              original_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff968;
              original_01.field_2._M_allocated_capacity._0_4_ = nHashType;
              original_01.field_2._M_allocated_capacity._4_4_ = uVar8;
              original_01.field_2._8_8_ = pmVar10;
              Untranslated((bilingual_str *)&local_5c8,original_01);
              local_654 = nIn;
              pmVar7 = std::
                       map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                       ::operator[](input_errors,(key_type_conflict *)&local_654);
              bilingual_str::operator=(pmVar7,(bilingual_str *)&local_5c8);
              bilingual_str::~bilingual_str((bilingual_str *)&local_5c8);
            }
            std::__cxx11::string::~string((string *)__return_storage_ptr__);
            goto LAB_001855ad;
          }
        }
        local_5c8.super_BaseSignatureCreator._vptr_BaseSignatureCreator._0_4_ = nIn;
        std::
        _Rb_tree<int,_std::pair<const_int,_bilingual_str>,_std::_Select1st<std::pair<const_int,_bilingual_str>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
        ::erase((_Rb_tree<int,_std::pair<const_int,_bilingual_str>,_std::_Select1st<std::pair<const_int,_bilingual_str>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                 *)input_errors,(key_type_conflict *)&local_5c8);
      }
LAB_001855ad:
      SignatureData::~SignatureData(&sigdata);
    }
    nIn = nIn + SCRIPT_ERR_UNKNOWN_ERROR;
  } while( true );
}

Assistant:

bool SignTransaction(CMutableTransaction& mtx, const SigningProvider* keystore, const std::map<COutPoint, Coin>& coins, int nHashType, std::map<int, bilingual_str>& input_errors)
{
    bool fHashSingle = ((nHashType & ~SIGHASH_ANYONECANPAY) == SIGHASH_SINGLE);

    // Use CTransaction for the constant parts of the
    // transaction to avoid rehashing.
    const CTransaction txConst(mtx);

    PrecomputedTransactionData txdata;
    std::vector<CTxOut> spent_outputs;
    for (unsigned int i = 0; i < mtx.vin.size(); ++i) {
        CTxIn& txin = mtx.vin[i];
        auto coin = coins.find(txin.prevout);
        if (coin == coins.end() || coin->second.IsSpent()) {
            txdata.Init(txConst, /*spent_outputs=*/{}, /*force=*/true);
            break;
        } else {
            spent_outputs.emplace_back(coin->second.out.nValue, coin->second.out.scriptPubKey);
        }
    }
    if (spent_outputs.size() == mtx.vin.size()) {
        txdata.Init(txConst, std::move(spent_outputs), true);
    }

    // Sign what we can:
    for (unsigned int i = 0; i < mtx.vin.size(); ++i) {
        CTxIn& txin = mtx.vin[i];
        auto coin = coins.find(txin.prevout);
        if (coin == coins.end() || coin->second.IsSpent()) {
            input_errors[i] = _("Input not found or already spent");
            continue;
        }
        const CScript& prevPubKey = coin->second.out.scriptPubKey;
        const CAmount& amount = coin->second.out.nValue;

        SignatureData sigdata = DataFromTransaction(mtx, i, coin->second.out);
        // Only sign SIGHASH_SINGLE if there's a corresponding output:
        if (!fHashSingle || (i < mtx.vout.size())) {
            ProduceSignature(*keystore, MutableTransactionSignatureCreator(mtx, i, amount, &txdata, nHashType), prevPubKey, sigdata);
        }

        UpdateInput(txin, sigdata);

        // amount must be specified for valid segwit signature
        if (amount == MAX_MONEY && !txin.scriptWitness.IsNull()) {
            input_errors[i] = _("Missing amount");
            continue;
        }

        ScriptError serror = SCRIPT_ERR_OK;
        if (!sigdata.complete && !VerifyScript(txin.scriptSig, prevPubKey, &txin.scriptWitness, STANDARD_SCRIPT_VERIFY_FLAGS, TransactionSignatureChecker(&txConst, i, amount, txdata, MissingDataBehavior::FAIL), &serror)) {
            if (serror == SCRIPT_ERR_INVALID_STACK_OPERATION) {
                // Unable to sign input and verification failed (possible attempt to partially sign).
                input_errors[i] = Untranslated("Unable to sign input, invalid stack size (possibly missing key)");
            } else if (serror == SCRIPT_ERR_SIG_NULLFAIL) {
                // Verification failed (possibly due to insufficient signatures).
                input_errors[i] = Untranslated("CHECK(MULTI)SIG failing with non-zero signature (possibly need more signatures)");
            } else {
                input_errors[i] = Untranslated(ScriptErrorString(serror));
            }
        } else {
            // If this input succeeds, make sure there is no error set for it
            input_errors.erase(i);
        }
    }
    return input_errors.empty();
}